

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  add_thousands_sep<char> sep;
  ostream_iterator<char,_char,_std::char_traits<char>_> out;
  uint uStack_3c;
  ostream_type *local_38;
  char *pcStack_30;
  ostream_type *local_20;
  char *pcStack_18;
  
  local_38 = it->_M_stream;
  pcStack_30 = it->_M_string;
  sep.sep_.size_ = 1;
  sep.sep_.data_ = (char *)(this + 0xc);
  sep._16_8_ = (ulong)uStack_3c << 0x20;
  out._M_string = (char *)&local_38;
  out._M_stream = (ostream_type *)&local_20;
  internal::
  format_decimal<char,unsigned_long,std::ostream_iterator<char,char,std::char_traits<char>>,fmt::v5::internal::add_thousands_sep<char>>
            (out,*(unsigned_long *)this,*(int *)(this + 8),sep);
  it->_M_stream = local_20;
  it->_M_string = pcStack_18;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }